

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmathlib.c
# Opt level: O1

int math_random(lua_State *L)

{
  int iVar1;
  int iVar2;
  lua_Integer lVar3;
  lua_Integer lVar4;
  
  iVar1 = rand();
  iVar2 = lua_gettop(L);
  if (iVar2 == 2) {
    lVar3 = luaL_checkinteger(L,1);
    iVar2 = 2;
  }
  else {
    if (iVar2 != 1) {
      if (iVar2 == 0) {
        lua_pushnumber(L,(double)iVar1 * 4.656612873077393e-10);
        return 1;
      }
      iVar1 = luaL_error(L,"wrong number of arguments");
      return iVar1;
    }
    lVar3 = 1;
    iVar2 = 1;
  }
  lVar4 = luaL_checkinteger(L,iVar2);
  if (lVar4 < lVar3) {
    luaL_argerror(L,1,"interval is empty");
  }
  if (lVar3 + 0x7fffffffffffffff < lVar4 && lVar3 < 0) {
    luaL_argerror(L,1,"interval too large");
  }
  lua_pushinteger(L,lVar3 + (long)((double)iVar1 * 4.656612873077393e-10 *
                                  ((double)(lVar4 - lVar3) + 1.0)));
  return 1;
}

Assistant:

static int math_random(lua_State *L) {
    lua_Integer low, up;
    double r = (double) l_rand() * (1.0 / ((double) L_RANDMAX + 1.0));
    switch (lua_gettop(L)) {  /* check number of arguments */
        case 0: {  /* no arguments */
            lua_pushnumber(L, (lua_Number) r);  /* Number between 0 and 1 */
            return 1;
        }
        case 1: {  /* only upper limit */
            low = 1;
            up = luaL_checkinteger(L, 1);
            break;
        }
        case 2: {  /* lower and upper limits */
            low = luaL_checkinteger(L, 1);
            up = luaL_checkinteger(L, 2);
            break;
        }
        default:
            return luaL_error(L, "wrong number of arguments");
    }
    /* random integer in the interval [low, up] */
    luaL_argcheck(L, low <= up, 1, "interval is empty");
    luaL_argcheck(L, low >= 0 || up <= LUA_MAXINTEGER + low, 1,
                  "interval too large");
    r *= (double) (up - low) + 1.0;
    lua_pushinteger(L, (lua_Integer) r + low);
    return 1;
}